

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx::create_pipeline_fp16s(InnerProduct_x86_avx *this,Option *opt)

{
  Mat *weight_data;
  int num_output;
  int iVar1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  int iVar4;
  
  num_output = (this->super_InnerProduct).num_output;
  iVar1 = (this->super_InnerProduct).weight_data_size;
  weight_data = &(this->super_InnerProduct).weight_data;
  iVar4 = cpu_support_x86_f16c();
  if (iVar4 != 0) {
    innerproduct_transform_kernel_fp16s_sse_f16c
              (weight_data,&this->weight_data_tm,iVar1 / num_output,num_output,opt);
  }
  if (opt->lightmode == true) {
    piVar2 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        __ptr = (this->super_InnerProduct).weight_data.data;
        pAVar3 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
    weight_data->data = (void *)0x0;
    (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}